

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthread.cpp
# Opt level: O1

void __thiscall
QtPrivate::BindingStatusOrList::setStatusAndClearList
          (BindingStatusOrList *this,QBindingStatus *status)

{
  ulong uVar1;
  long *plVar2;
  void *pvVar3;
  long *plVar4;
  undefined8 *puVar5;
  
  uVar1 = (this->data).super___atomic_base<unsigned_long_long>._M_i;
  puVar5 = (undefined8 *)(uVar1 & 0xfffffffffffffffe);
  if (puVar5 != (undefined8 *)0x0 && (uVar1 & 1) != 0) {
    plVar2 = (long *)puVar5[1];
    for (plVar4 = (long *)*puVar5; plVar4 != plVar2; plVar4 = plVar4 + 1) {
      QObjectPrivate::reinitBindingStorageAfterThreadMove(*(QObjectPrivate **)(*plVar4 + 8));
    }
    pvVar3 = (void *)*puVar5;
    if (pvVar3 != (void *)0x0) {
      operator_delete(pvVar3,puVar5[2] - (long)pvVar3);
    }
    operator_delete(puVar5,0x18);
  }
  (this->data).super___atomic_base<unsigned_long_long>._M_i = (__int_type)status;
  return;
}

Assistant:

void QtPrivate::BindingStatusOrList::setStatusAndClearList(QBindingStatus *status) noexcept
{

    if (auto pendingObjects = list()) {
        for (auto obj: *pendingObjects)
            QObjectPrivate::get(obj)->reinitBindingStorageAfterThreadMove();
        delete pendingObjects;
    }
    // synchronizes-with the load-acquire in bindingStatus():
    data.store(encodeBindingStatus(status), std::memory_order_release);
}